

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

int cppcms_capi_session_set_session_cookie(cppcms_capi_session *session,char *session_cookie_value)

{
  int iVar1;
  
  if (session == (cppcms_capi_session *)0x0) {
    iVar1 = -1;
  }
  else {
    anon_unknown.dwarf_329815::check_str(session_cookie_value);
    cppcms_capi_session::check(session);
    iVar1 = 0;
    std::__cxx11::string::assign((char *)&(session->adapter).value);
  }
  return iVar1;
}

Assistant:

int cppcms_capi_session_set_session_cookie(cppcms_capi_session *session,char const *session_cookie_value)
{
	TRY {
		if(!session)
			return -1;
		check_str(session_cookie_value);
		session->check();
		session->adapter.value = session_cookie_value;
	}